

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preset.cpp
# Opt level: O2

void InitPresetArray(void)

{
  RookCannonCanGet *pRVar1;
  RookCannonMask *pRVar2;
  byte bVar3;
  uint uVar4;
  int (*paaiVar5) [2] [10];
  uint uVar6;
  long lVar7;
  ushort uVar8;
  int (*paaiVar10) [2] [10];
  ulong uVar11;
  int j;
  int iVar12;
  uint uVar13;
  UINT16 UVar14;
  int i_2;
  int i_1;
  uint uVar15;
  int (*paaiVar16) [2] [10];
  long lVar17;
  int i_3;
  uint uVar18;
  int (*paaiVar19) [2] [10];
  int (*paaiVar20) [2] [10];
  ushort uVar21;
  int (*paiVar22) [10];
  long lVar23;
  int i;
  ulong uVar24;
  int j_1;
  byte bVar25;
  int iVar26;
  ushort uVar27;
  uint local_48;
  uint local_44;
  uint local_40;
  int local_3c;
  uint uVar9;
  
  paaiVar5 = PAWN_CAN_GET;
  paaiVar10 = ADVISOR_CAN_GET;
  paaiVar16 = BISHOP_EYE;
  paaiVar19 = KING_CAN_GET;
  paaiVar20 = BISHOP_CAN_GET;
  paiVar22 = HORSE_CAN_GET;
  for (uVar24 = 0; uVar24 != 0x100; uVar24 = uVar24 + 1) {
    for (lVar7 = 0; lVar7 != 0x28; lVar7 = lVar7 + 4) {
      *(undefined4 *)((long)*paiVar22 + lVar7) = 0;
      *(undefined4 *)((long)(*paaiVar20)[0] + lVar7) = 0;
      *(undefined4 *)((long)(*paaiVar20)[1] + lVar7) = 0;
      *(undefined4 *)((long)(*paaiVar19)[0] + lVar7) = 0;
      *(undefined4 *)((long)(*paaiVar19)[1] + lVar7) = 0;
      *(undefined4 *)((long)(*paaiVar16)[0] + lVar7) = 0;
      *(undefined4 *)((long)(*paaiVar16)[1] + lVar7) = 0;
      *(undefined4 *)((long)(*paaiVar10)[0] + lVar7) = 0;
      *(undefined4 *)((long)(*paaiVar10)[1] + lVar7) = 0;
      *(undefined4 *)((long)(*paaiVar5)[0] + lVar7) = 0;
      *(undefined4 *)((long)(*paaiVar5)[1] + lVar7) = 0;
    }
    if (""[uVar24] == '\0') {
      UVar14 = 0;
    }
    else {
      UVar14 = (UINT16)(1 << (0xb - ((byte)uVar24 & 0xf) & 0x1f));
      BIT_COL_MASK[uVar24] = (UINT16)(1 << (0xcU - (char)(uVar24 >> 4) & 0x1f));
    }
    BIT_ROW_MASK[uVar24] = UVar14;
    paaiVar5 = paaiVar5 + 1;
    paaiVar10 = paaiVar10 + 1;
    paaiVar16 = paaiVar16 + 1;
    paaiVar19 = paaiVar19 + 1;
    paaiVar20 = paaiVar20 + 1;
    paiVar22 = paiVar22 + 1;
  }
  uVar18 = 0x33;
  while (uVar18 != 0) {
    lVar7 = (long)(int)uVar18;
    bVar25 = LEGAL_POSITION[0][lVar7];
    if ((bVar25 & 2) != 0) {
      iVar12 = 0;
      for (lVar17 = 0; lVar17 != 0x10; lVar17 = lVar17 + 4) {
        lVar23 = *(int *)((long)KING_DIRECTION + lVar17) + lVar7;
        if ((LEGAL_POSITION[0][lVar23] & 2) != 0) {
          KING_CAN_GET[lVar7][0][iVar12] = (int)lVar23;
          iVar12 = iVar12 + 1;
        }
      }
    }
    bVar3 = LEGAL_POSITION[1][lVar7];
    if ((bVar3 & 2) != 0) {
      iVar12 = 0;
      for (lVar17 = 0; lVar17 != 0x10; lVar17 = lVar17 + 4) {
        lVar23 = *(int *)((long)KING_DIRECTION + lVar17) + lVar7;
        if ((LEGAL_POSITION[1][lVar23] & 2) != 0) {
          *(int *)(lVar7 * 0x50 + 0x2eed68 + (long)iVar12 * 4) = (int)lVar23;
          iVar12 = iVar12 + 1;
        }
      }
    }
    if ((bVar25 & 4) != 0) {
      iVar12 = 0;
      for (lVar17 = 0; lVar17 != 0x10; lVar17 = lVar17 + 4) {
        lVar23 = *(int *)((long)ADVISOR_DIRECTION + lVar17) + lVar7;
        if ((LEGAL_POSITION[0][lVar23] & 4) != 0) {
          ADVISOR_CAN_GET[lVar7][0][iVar12] = (int)lVar23;
          iVar12 = iVar12 + 1;
        }
      }
    }
    if ((bVar3 & 4) != 0) {
      iVar12 = 0;
      for (lVar17 = 0; lVar17 != 0x10; lVar17 = lVar17 + 4) {
        lVar23 = *(int *)((long)ADVISOR_DIRECTION + lVar17) + lVar7;
        if ((LEGAL_POSITION[1][lVar23] & 4) != 0) {
          *(int *)(lVar7 * 0x50 + 0x2f3d68 + (long)iVar12 * 4) = (int)lVar23;
          iVar12 = iVar12 + 1;
        }
      }
    }
    if ((bVar25 & 0x10) != 0) {
      iVar12 = 0;
      for (lVar17 = 0; lVar17 != 0x10; lVar17 = lVar17 + 4) {
        lVar23 = *(int *)((long)BISHOP_DIRECTION + lVar17) + lVar7;
        if ((LEGAL_POSITION[0][lVar23] & 0x10) != 0) {
          BISHOP_CAN_GET[lVar7][0][iVar12] = (int)lVar23;
          BISHOP_EYE[lVar7][0][iVar12] = *(int *)((long)BISHOP_EYE_DIRECTION + lVar17) + uVar18;
          iVar12 = iVar12 + 1;
        }
      }
    }
    if ((bVar3 & 0x10) != 0) {
      iVar12 = 0;
      for (lVar17 = 0; lVar17 != 0x10; lVar17 = lVar17 + 4) {
        lVar23 = *(int *)((long)BISHOP_DIRECTION + lVar17) + lVar7;
        if ((LEGAL_POSITION[1][lVar23] & 0x10) != 0) {
          *(int *)(lVar7 * 0x50 + 0x2fdd68 + (long)iVar12 * 4) = (int)lVar23;
          *(uint *)(lVar7 * 0x50 + 0x302d68 + (long)iVar12 * 4) =
               *(int *)((long)BISHOP_EYE_DIRECTION + lVar17) + uVar18;
          iVar12 = iVar12 + 1;
        }
      }
    }
    if ((bVar25 & 1) != 0) {
      iVar12 = 0;
      for (lVar17 = 0; lVar17 != 0x20; lVar17 = lVar17 + 4) {
        lVar23 = *(int *)((long)HORSE_DIRECTION + lVar17) + lVar7;
        if ((LEGAL_POSITION[0][lVar23] & 1) != 0) {
          HORSE_CAN_GET[lVar7][iVar12] = (int)lVar23;
          HORSE_LEG[lVar7][iVar12] = *(int *)((long)HORSE_LEG_DIRECTION + lVar17) + uVar18;
          iVar12 = iVar12 + 1;
        }
      }
    }
    if ((bVar25 & 8) != 0) {
      iVar12 = 0;
      for (lVar17 = 0; lVar17 != 0xc; lVar17 = lVar17 + 4) {
        lVar23 = *(int *)((long)PAWN_DIRECTION[0] + lVar17) + lVar7;
        if ((LEGAL_POSITION[0][lVar23] & 8) != 0) {
          PAWN_CAN_GET[lVar7][0][iVar12] = (int)lVar23;
          iVar12 = iVar12 + 1;
        }
      }
    }
    if ((bVar3 & 8) != 0) {
      iVar12 = 0;
      for (lVar17 = 0; lVar17 != 3; lVar17 = lVar17 + 1) {
        lVar23 = PAWN_DIRECTION[1][lVar17] + lVar7;
        if ((LEGAL_POSITION[1][lVar23] & 8) != 0) {
          *(int *)(lVar7 * 0x50 + 0x2f8d68 + (long)iVar12 * 4) = (int)lVar23;
          iVar12 = iVar12 + 1;
        }
      }
    }
    uVar15 = uVar18 & 0xf;
    uVar6 = uVar18 + 8;
    if (uVar18 == 0xcb) {
      uVar6 = 0;
    }
    uVar18 = uVar18 + 1;
    if (uVar15 == 0xb) {
      uVar18 = uVar6;
    }
  }
  local_48 = 2;
  local_44 = 9;
  local_3c = -2;
  local_40 = 7;
  uVar24 = 0;
  do {
    if (uVar24 == 9) {
      local_48 = 2;
      local_44 = 10;
      local_3c = -2;
      local_40 = 8;
      uVar24 = 0;
      do {
        if (uVar24 == 10) {
          return;
        }
        for (lVar7 = 0; lVar7 != 0x400; lVar7 = lVar7 + 1) {
          pRVar1 = ROOK_CANNON_CAN_GET_COL[uVar24] + lVar7;
          pRVar2 = ROOK_CANNON_CAN_GET_COL_MASK[uVar24] + lVar7;
          pRVar2->no_capture = 0;
          pRVar2->rook_capture = 0;
          pRVar2->cannon_capture = 0;
          pRVar2->supercannon_capture = 0;
          *pRVar1 = (RookCannonCanGet)((ulong)((int)uVar24 + 3U & 0xff) * 0x101010101010101);
          uVar15 = 0;
          uVar18 = local_40;
          for (uVar6 = local_48; uVar13 = (uint)lVar7, uVar6 != 0xb; uVar6 = uVar6 + 1) {
            uVar9 = 1 << ((byte)uVar18 & 0x1f);
            uVar8 = (ushort)uVar9;
            if ((uVar13 >> (uVar18 & 0x1f) & 1) != 0) {
              pRVar1->rook_capture[0] = (char)uVar6 + '\x02';
              pRVar2->rook_capture = uVar8;
              goto LAB_001080ab;
            }
            pRVar1->no_capture[0] = (char)uVar6 + '\x02';
            uVar15 = uVar15 | uVar9;
            pRVar2->no_capture = (UINT16)uVar15;
            uVar18 = uVar18 - 1;
          }
          uVar8 = 0;
          uVar6 = 0xb;
LAB_001080ab:
          uVar18 = 10;
          if (10 < uVar6) {
            uVar18 = uVar6;
          }
          uVar9 = 9 - uVar6;
          for (; uVar6 < 10; uVar6 = uVar6 + 1) {
            uVar21 = (ushort)(1 << ((byte)uVar9 & 0x1f));
            if ((uVar13 >> (uVar9 & 0x1f) & 1) != 0) {
              pRVar1->cannon_capture[0] = (char)uVar6 + '\x03';
              pRVar2->cannon_capture = uVar21;
              uVar18 = uVar6;
              goto LAB_001080f1;
            }
            uVar9 = uVar9 - 1;
          }
          uVar21 = 0;
LAB_001080f1:
          uVar9 = uVar18 + 3;
          uVar6 = 8 - uVar18;
          do {
            if (8 < uVar18) {
              uVar27 = 0;
              goto LAB_00108125;
            }
            uVar18 = uVar18 + 1;
            uVar27 = (ushort)(1 << ((byte)uVar6 & 0x1f));
            bVar25 = (char)uVar9 + 1;
            uVar9 = (uint)bVar25;
            uVar4 = uVar6 & 0x1f;
            uVar6 = uVar6 - 1;
          } while ((uVar13 >> uVar4 & 1) == 0);
          pRVar1->supercannon_capture[0] = bVar25;
          pRVar2->supercannon_capture = uVar27;
LAB_00108125:
          uVar11 = uVar24 & 0xffffffff;
          uVar18 = local_44;
          for (iVar12 = local_3c; iVar26 = (int)uVar11, 0 < iVar12 + 2; iVar12 = iVar12 + -1) {
            uVar6 = 1 << ((byte)uVar18 & 0x1f);
            if ((uVar13 >> (uVar18 & 0x1f) & 1) != 0) {
              pRVar1->rook_capture[1] = (char)iVar12 + '\x04';
              pRVar2->rook_capture = uVar8 | (ushort)uVar6;
              goto LAB_00108178;
            }
            pRVar1->no_capture[1] = (char)iVar12 + '\x04';
            uVar15 = uVar15 | uVar6;
            pRVar2->no_capture = (UINT16)uVar15;
            uVar18 = uVar18 + 1;
            uVar11 = (ulong)(iVar26 - 1);
          }
          iVar12 = -2;
LAB_00108178:
          if (iVar26 < 1) {
            iVar26 = 0;
          }
          uVar6 = 0xb - iVar26;
          uVar18 = 0xc - iVar26;
          for (; -1 < iVar12; iVar12 = iVar12 + -1) {
            if ((uVar13 >> (uVar6 & 0x1f) & 1) != 0) {
              pRVar1->cannon_capture[1] = (char)iVar12 + '\x03';
              pRVar2->cannon_capture = uVar21 | (ushort)(1 << ((byte)uVar6 & 0x1f));
              break;
            }
            uVar6 = uVar6 + 1;
            uVar18 = uVar18 + 1;
          }
          do {
            if (iVar12 < 1) goto LAB_001081e7;
            bVar25 = (byte)uVar18;
            iVar12 = iVar12 + -1;
            uVar6 = uVar18 & 0x1f;
            uVar18 = uVar18 + 1;
          } while ((uVar13 >> uVar6 & 1) == 0);
          pRVar1->supercannon_capture[1] = (char)iVar12 + '\x03';
          pRVar2->supercannon_capture = uVar27 | (ushort)(1 << (bVar25 & 0x1f));
LAB_001081e7:
        }
        uVar24 = uVar24 + 1;
        local_48 = local_48 + 1;
        local_40 = local_40 - 1;
        local_3c = local_3c + 1;
        local_44 = local_44 - 1;
      } while( true );
    }
    for (lVar7 = 0; lVar7 != 0x200; lVar7 = lVar7 + 1) {
      pRVar1 = ROOK_CANNON_CAN_GET_ROW[uVar24] + lVar7;
      pRVar2 = ROOK_CANNON_CAN_GET_ROW_MASK[uVar24] + lVar7;
      pRVar2->no_capture = 0;
      pRVar2->rook_capture = 0;
      pRVar2->cannon_capture = 0;
      pRVar2->supercannon_capture = 0;
      *pRVar1 = (RookCannonCanGet)((ulong)((int)uVar24 + 3U & 0xff) * 0x101010101010101);
      uVar15 = 0;
      uVar6 = local_40;
      for (uVar18 = local_48; uVar13 = (uint)lVar7, uVar18 != 10; uVar18 = uVar18 + 1) {
        uVar9 = 1 << ((byte)uVar6 & 0x1f);
        uVar8 = (ushort)uVar9;
        if ((uVar13 >> (uVar6 & 0x1f) & 1) != 0) {
          pRVar1->rook_capture[0] = (char)uVar18 + '\x02';
          pRVar2->rook_capture = uVar8;
          goto LAB_00107e85;
        }
        pRVar1->no_capture[0] = (char)uVar18 + '\x02';
        uVar15 = uVar15 | uVar9;
        pRVar2->no_capture = (UINT16)uVar15;
        uVar6 = uVar6 - 1;
      }
      uVar8 = 0;
      uVar18 = 10;
LAB_00107e85:
      uVar6 = 9;
      if (9 < uVar18) {
        uVar6 = uVar18;
      }
      uVar9 = 8 - uVar18;
      for (; uVar18 < 9; uVar18 = uVar18 + 1) {
        uVar21 = (ushort)(1 << ((byte)uVar9 & 0x1f));
        if ((uVar13 >> (uVar9 & 0x1f) & 1) != 0) {
          pRVar1->cannon_capture[0] = (char)uVar18 + '\x03';
          pRVar2->cannon_capture = uVar21;
          uVar6 = uVar18;
          goto LAB_00107ec5;
        }
        uVar9 = uVar9 - 1;
      }
      uVar21 = 0;
LAB_00107ec5:
      uVar9 = uVar6 + 3;
      uVar18 = 7 - uVar6;
      do {
        if (7 < uVar6) {
          uVar27 = 0;
          goto LAB_00107ef6;
        }
        uVar6 = uVar6 + 1;
        uVar27 = (ushort)(1 << ((byte)uVar18 & 0x1f));
        bVar25 = (char)uVar9 + 1;
        uVar9 = (uint)bVar25;
        uVar4 = uVar18 & 0x1f;
        uVar18 = uVar18 - 1;
      } while ((uVar13 >> uVar4 & 1) == 0);
      pRVar1->supercannon_capture[0] = bVar25;
      pRVar2->supercannon_capture = uVar27;
LAB_00107ef6:
      uVar11 = uVar24 & 0xffffffff;
      uVar18 = local_44;
      for (iVar12 = local_3c; iVar26 = (int)uVar11, 0 < iVar12 + 2; iVar12 = iVar12 + -1) {
        uVar6 = 1 << ((byte)uVar18 & 0x1f);
        if ((uVar13 >> (uVar18 & 0x1f) & 1) != 0) {
          pRVar1->rook_capture[1] = (char)iVar12 + '\x04';
          pRVar2->rook_capture = uVar8 | (ushort)uVar6;
          goto LAB_00107f50;
        }
        pRVar1->no_capture[1] = (char)iVar12 + '\x04';
        uVar15 = uVar15 | uVar6;
        pRVar2->no_capture = (UINT16)uVar15;
        uVar18 = uVar18 + 1;
        uVar11 = (ulong)(iVar26 - 1);
      }
      iVar12 = -2;
LAB_00107f50:
      if (iVar26 < 1) {
        iVar26 = 0;
      }
      uVar6 = 10 - iVar26;
      uVar18 = 0xb - iVar26;
      for (; -1 < iVar12; iVar12 = iVar12 + -1) {
        if ((uVar13 >> (uVar6 & 0x1f) & 1) != 0) {
          pRVar1->cannon_capture[1] = (char)iVar12 + '\x03';
          pRVar2->cannon_capture = uVar21 | (ushort)(1 << ((byte)uVar6 & 0x1f));
          break;
        }
        uVar6 = uVar6 + 1;
        uVar18 = uVar18 + 1;
      }
      do {
        if (iVar12 < 1) goto LAB_00107fb9;
        bVar25 = (byte)uVar18;
        iVar12 = iVar12 + -1;
        uVar6 = uVar18 & 0x1f;
        uVar18 = uVar18 + 1;
      } while ((uVar13 >> uVar6 & 1) == 0);
      pRVar1->supercannon_capture[1] = (char)iVar12 + '\x03';
      pRVar2->supercannon_capture = uVar27 | (ushort)(1 << (bVar25 & 0x1f));
LAB_00107fb9:
    }
    uVar24 = uVar24 + 1;
    local_48 = local_48 + 1;
    local_40 = local_40 - 1;
    local_3c = local_3c + 1;
    local_44 = local_44 - 1;
  } while( true );
}

Assistant:

void InitPresetArray(){
    // 1. 初始化预置数组
    for(int i = 0; i < 256; i ++){
        // 1.1. 初始化其他预置数组
        for(int j = 0; j < 10; j ++){
            HORSE_CAN_GET[i][j] = 0;
            HORSE_CAN_GET[i][j] = 0;
            BISHOP_CAN_GET[i][0][j] = 0;
            BISHOP_CAN_GET[i][1][j] = 0;
            KING_CAN_GET[i][0][j] = 0;
            KING_CAN_GET[i][1][j] = 0;
            BISHOP_EYE[i][0][j] = 0;
            BISHOP_EYE[i][1][j] = 0;
            ADVISOR_CAN_GET[i][0][j] = 0;
            ADVISOR_CAN_GET[i][1][j] = 0;
            PAWN_CAN_GET[i][0][j] = 0;
            PAWN_CAN_GET[i][1][j] = 0;
        }

        // 1.2. 初始化位行位列屏蔽位
        if(ON_BOARD[i]){
            BIT_ROW_MASK[i] = 1 << RowBitOpration(GetCol(i) - 3);
            BIT_COL_MASK[i] = 1 << ColBitOpration(GetRow(i) - 3);
        }
        else{
            BIT_ROW_MASK[i] = 0;
            BIT_ROW_MASK[i] = 0;
        }
    }
    int position = BOARD_FIRST_POSITION;    // 初始位置为棋盘上的第一个位置

    // 2.循环棋盘上的每一个位置
    //   (备注： POSITION_MASK[7] = {2, 4, 16, 1, 1, 1, 8} 各子力的特征值 将士相车马炮卒)
    while(position != 0){
        int num_of_can_get = 0;             // 预生成着法的个数
        int next_position;                  // 着后的下一个位置

        // 2.1. 生成帅（红）的在该位置的可行走法
        if(LEGAL_POSITION[RED][position] & POSITION_MASK[0]){
            for(int i = 0; i < 4; i ++){
                next_position = position + KING_DIRECTION[i];
                if(LEGAL_POSITION[RED][next_position] & POSITION_MASK[0]){
                    KING_CAN_GET[position][RED][num_of_can_get] = next_position;
                    num_of_can_get ++;
                }
            }
        }
        num_of_can_get = 0;

        // 2.2. 生成将（黑）在该位置的可行走法
        if(LEGAL_POSITION[BLACK][position] & POSITION_MASK[0]){
            for(int i = 0; i < 4; i ++){
                next_position = position + KING_DIRECTION[i];
                if(LEGAL_POSITION[BLACK][next_position] & POSITION_MASK[0]){
                    KING_CAN_GET[position][BLACK][num_of_can_get] = next_position;
                    num_of_can_get ++;
                }
            }
        }
        num_of_can_get = 0;

        
        // 2.3. 生成仕(红)在该位置的可行走法
        if(LEGAL_POSITION[RED][position] & POSITION_MASK[1]){
            for(int i = 0; i < 4; i ++){
                next_position = position + ADVISOR_DIRECTION[i];
                if(LEGAL_POSITION[RED][next_position] & POSITION_MASK[1]){
                    ADVISOR_CAN_GET[position][RED][num_of_can_get] = next_position;
                    num_of_can_get ++;
                }
            }
        }
        num_of_can_get = 0;

        // 2.3. 生成士(黑)在该位置的可行走法
        if(LEGAL_POSITION[BLACK][position] & POSITION_MASK[1]){
            for(int i = 0; i < 4; i ++){
                next_position = position + ADVISOR_DIRECTION[i];
                if(LEGAL_POSITION[BLACK][next_position] & POSITION_MASK[1]){
                    ADVISOR_CAN_GET[position][BLACK][num_of_can_get] = next_position;
                    num_of_can_get ++;
                }
            }
        }
        num_of_can_get = 0;

        // 2.4. 生成象(红)在该位置的可行走法
        if(LEGAL_POSITION[RED][position] & POSITION_MASK[2]){
            for(int i = 0; i < 4; i ++){
                next_position = position + BISHOP_DIRECTION[i];
                if(LEGAL_POSITION[RED][next_position] & POSITION_MASK[2]){
                    BISHOP_CAN_GET[position][RED][num_of_can_get] = next_position;
                    BISHOP_EYE[position][RED][num_of_can_get] = position + BISHOP_EYE_DIRECTION[i];
                    num_of_can_get ++;
                }
            }
        }
        num_of_can_get = 0;

        // 2.5. 生成象(黑)在该位置的可行走法
        if(LEGAL_POSITION[BLACK][position] & POSITION_MASK[2]){
            for(int i = 0; i < 4; i ++){
                next_position = position + BISHOP_DIRECTION[i];
                if(LEGAL_POSITION[BLACK][next_position] & POSITION_MASK[2]){
                    BISHOP_CAN_GET[position][BLACK][num_of_can_get] = next_position;
                    BISHOP_EYE[position][BLACK][num_of_can_get] = position + BISHOP_EYE_DIRECTION[i];
                    num_of_can_get ++;
                }
            }
        }
        num_of_can_get = 0;

        // 2.6. 生成马在该位置的可行走法
        if(LEGAL_POSITION[RED][position] & POSITION_MASK[4]){
            for(int i = 0; i < 8; i ++){
                next_position = position + HORSE_DIRECTION[i];
                if(LEGAL_POSITION[RED][next_position] & POSITION_MASK[4]){
                    HORSE_CAN_GET[position][num_of_can_get] = next_position;
                    HORSE_LEG[position][num_of_can_get] = position + HORSE_LEG_DIRECTION[i];
                    num_of_can_get ++;
                }
            }
        }
        num_of_can_get = 0;

        // 2.7. 生成兵(红)在该位置的可行走法
        if(LEGAL_POSITION[RED][position] & POSITION_MASK[6]){
            for(int i = 0; i < 3; i ++){
                next_position = position + PAWN_DIRECTION[RED][i];
                if(LEGAL_POSITION[RED][next_position] & POSITION_MASK[6]){
                    PAWN_CAN_GET[position][RED][num_of_can_get] = next_position; 
                    num_of_can_get ++;
                }
            }
        }
        num_of_can_get = 0;

        // 2.8. 生成兵(黑)在该位置的可行走法
        if(LEGAL_POSITION[BLACK][position] & POSITION_MASK[6]){
            for(int i = 0; i < 3; i ++){
                next_position = position + PAWN_DIRECTION[BLACK][i];
                if(LEGAL_POSITION[BLACK][next_position] & POSITION_MASK[6]){
                    PAWN_CAN_GET[position][BLACK][num_of_can_get] = next_position; 
                    num_of_can_get ++;
                }
            }
        }
        num_of_can_get = 0;

        position = NextBoardPosition(position);
    }

    // 3.生成位行位列预置数组
    
    // 3.1. 循环一行中的每一列
    for(int i = 0; i < 9; i ++){
        // 循环一行中的每种状态(位置是否有棋子)
        for(int j = 0; j < (1 << 9); j ++){
            // 3.1.1 将着法初始化(用当前位置初始化)
            ROOK_CANNON_CAN_GET_ROW[i][j].cannon_capture[0] = ROOK_CANNON_CAN_GET_ROW[i][j].cannon_capture[1] = i + 3;
            ROOK_CANNON_CAN_GET_ROW[i][j].no_capture[0] = ROOK_CANNON_CAN_GET_ROW[i][j].no_capture[1] = i + 3;
            ROOK_CANNON_CAN_GET_ROW[i][j].rook_capture[0] = ROOK_CANNON_CAN_GET_ROW[i][j].rook_capture[1] = i + 3;
            ROOK_CANNON_CAN_GET_ROW[i][j].supercannon_capture[0] = ROOK_CANNON_CAN_GET_ROW[i][j].supercannon_capture[1] = i + 3;
            ROOK_CANNON_CAN_GET_ROW_MASK[i][j].cannon_capture = ROOK_CANNON_CAN_GET_ROW_MASK[i][j].supercannon_capture = ROOK_CANNON_CAN_GET_ROW_MASK[i][j].no_capture = ROOK_CANNON_CAN_GET_ROW_MASK[i][j].rook_capture = 0;
            int col;
            // 3.1.2 生成车炮右边的着法
            for(col = i + 1; col < 9; col ++){
                // 此状态下，该列没有棋子
                if((j & (1 << RowBitOpration(col))) == 0){
                    ROOK_CANNON_CAN_GET_ROW[i][j].no_capture[0] = col + 3;
                    ROOK_CANNON_CAN_GET_ROW_MASK[i][j].no_capture |= (1 << RowBitOpration(col));
                }
                // 此状态下，该列有棋子,可生成吃子着法
                else{
                    ROOK_CANNON_CAN_GET_ROW[i][j].rook_capture[0] = col + 3;
                    ROOK_CANNON_CAN_GET_ROW_MASK[i][j].rook_capture |= (1 << RowBitOpration(col));
                    break;
                }
            }
            for(col ++; col < 9; col ++){
                // 已经隔了一子，判断炮是否有吃子着法
                if((j & (1 << RowBitOpration(col))) != 0){
                    ROOK_CANNON_CAN_GET_ROW[i][j].cannon_capture[0] = col + 3;
                    ROOK_CANNON_CAN_GET_ROW_MASK[i][j].cannon_capture |= (1 << RowBitOpration(col));
                    break;
                }
            }
            for(col ++; col < 9; col ++){
                // 已经隔了两子，判断超级炮是否有吃子着法
                if((j & (1 << RowBitOpration(col))) != 0){
                    ROOK_CANNON_CAN_GET_ROW[i][j].supercannon_capture[0] = col + 3;
                    ROOK_CANNON_CAN_GET_ROW_MASK[i][j].supercannon_capture |= (1 << RowBitOpration(col));
                    break;
                }
            }
            // 3.1.3 生成车炮左边的着法
            for(col = i - 1; col >= 0; col--){
                // 此状态下，该列没有棋子
                if((j & (1 << RowBitOpration(col))) == 0){
                    ROOK_CANNON_CAN_GET_ROW[i][j].no_capture[1] = col + 3;
                    ROOK_CANNON_CAN_GET_ROW_MASK[i][j].no_capture |= (1 << RowBitOpration(col));
                }
                // 此状态下，该列有棋子,可生成吃子着法
                else{
                    ROOK_CANNON_CAN_GET_ROW[i][j].rook_capture[1] = col + 3;
                    ROOK_CANNON_CAN_GET_ROW_MASK[i][j].rook_capture |= (1 << RowBitOpration(col));
                    break;
                }
            }
            for(col --; col >= 0; col --){
                // 已经隔了一子，判断炮是否有吃子着法
                if((j & (1 << RowBitOpration(col))) != 0){
                    ROOK_CANNON_CAN_GET_ROW[i][j].cannon_capture[1] = col + 3;
                    ROOK_CANNON_CAN_GET_ROW_MASK[i][j].cannon_capture |= (1 << RowBitOpration(col));
                    break;
                }
            }
            for(col --; col >= 0; col --){
                // 已经隔了两子，判断超级炮是否有吃子着法
                if((j & (1 << RowBitOpration(col))) != 0){
                    ROOK_CANNON_CAN_GET_ROW[i][j].supercannon_capture[1] = col + 3;
                    ROOK_CANNON_CAN_GET_ROW_MASK[i][j].supercannon_capture |= (1 << RowBitOpration(col));
                    break;
                }
            }
        }
    }
    // 3.2. 循环一列中的每一行
    for(int i = 0; i < 10; i ++){
        // 循环一列的每一个状态
        for(int j = 0; j < (1 << 10); j ++){
            // 3.2.1 着法初始化
            ROOK_CANNON_CAN_GET_COL[i][j].cannon_capture[0] = ROOK_CANNON_CAN_GET_COL[i][j].cannon_capture[1] = i + 3;
            ROOK_CANNON_CAN_GET_COL[i][j].no_capture[0] = ROOK_CANNON_CAN_GET_COL[i][j].no_capture[1] = i + 3;
            ROOK_CANNON_CAN_GET_COL[i][j].rook_capture[0] = ROOK_CANNON_CAN_GET_COL[i][j].rook_capture[1] = i + 3;
            ROOK_CANNON_CAN_GET_COL[i][j].supercannon_capture[0] = ROOK_CANNON_CAN_GET_COL[i][j].supercannon_capture[1] = i + 3;
            ROOK_CANNON_CAN_GET_COL_MASK[i][j].cannon_capture = ROOK_CANNON_CAN_GET_COL_MASK[i][j].supercannon_capture = ROOK_CANNON_CAN_GET_COL_MASK[i][j].no_capture = ROOK_CANNON_CAN_GET_COL_MASK[i][j].rook_capture = 0;
            // 3.2.2 生成车炮向下的着法 
            int row;
            for(row = i + 1; row < 10; row ++){
                // 当前状态下该行无棋子
                if((j & (1 << ColBitOpration(row))) == 0){
                    ROOK_CANNON_CAN_GET_COL[i][j].no_capture[0] = row + 3;
                    ROOK_CANNON_CAN_GET_COL_MASK[i][j].no_capture |= (1 << ColBitOpration(row));
                }
                // 当前状态下该行有棋子
                else{
                    ROOK_CANNON_CAN_GET_COL[i][j].rook_capture[0] = row + 3;
                    ROOK_CANNON_CAN_GET_COL_MASK[i][j].rook_capture |= (1 << ColBitOpration(row));
                    break;
                }
            }
            for(row ++; row < 10; row ++){
                // 隔了一子，生成炮吃法
                if((j & (1 << ColBitOpration(row))) != 0){
                    ROOK_CANNON_CAN_GET_COL[i][j].cannon_capture[0] = row + 3;
                    ROOK_CANNON_CAN_GET_COL_MASK[i][j].cannon_capture |= (1 << ColBitOpration(row));
                    break;
                }
            }
            for(row ++; row < 10; row ++){
                // 隔了两子，生成超级炮吃法
                if((j & (1 << ColBitOpration(row))) != 0){
                    ROOK_CANNON_CAN_GET_COL[i][j].supercannon_capture[0] = row + 3;
                    ROOK_CANNON_CAN_GET_COL_MASK[i][j].supercannon_capture |= (1 << ColBitOpration(row));
                    break;
                }
            }
            // 3.2.3 生成车炮向上的着法
            for(row = i - 1; row >= 0; row --){
                // 当前状态下该行无棋子
                if((j & (1 << ColBitOpration(row))) == 0){
                    ROOK_CANNON_CAN_GET_COL[i][j].no_capture[1] = row + 3;
                    ROOK_CANNON_CAN_GET_COL_MASK[i][j].no_capture |= (1 << ColBitOpration(row));
                }
                // 当前状态下该行有棋子
                else{
                    ROOK_CANNON_CAN_GET_COL[i][j].rook_capture[1] = row + 3;
                    ROOK_CANNON_CAN_GET_COL_MASK[i][j].rook_capture |= (1 << ColBitOpration(row));
                    break;
                }
            }
            for(row --; row >= 0; row --){
                // 隔了一子，生成炮吃法
                if((j & (1 << ColBitOpration(row))) != 0){
                    ROOK_CANNON_CAN_GET_COL[i][j].cannon_capture[1] = row + 3;
                    ROOK_CANNON_CAN_GET_COL_MASK[i][j].cannon_capture |= (1 << ColBitOpration(row));
                    break;
                }
            }
            for(row --; row >= 0; row --){
                // 隔了两子，生成超级炮吃法
                if((j & (1 << ColBitOpration(row))) != 0){
                    ROOK_CANNON_CAN_GET_COL[i][j].supercannon_capture[1] = row + 3;
                    ROOK_CANNON_CAN_GET_COL_MASK[i][j].supercannon_capture |= (1 << ColBitOpration(row));
                    break;
                }
            }
        }
    }  
}